

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O0

variable_set * __thiscall merlin::variable_set::operator=(variable_set *this,variable_set *B)

{
  unsigned_long *__first;
  size_t sVar1;
  reference pvVar2;
  allocator<unsigned_long> local_31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  variable_set *local_18;
  variable_set *B_local;
  variable_set *this_local;
  
  local_18 = B;
  B_local = this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->m_v,&B->m_v);
  __first = local_18->m_d;
  sVar1 = size(local_18);
  std::allocator<unsigned_long>::allocator(&local_31);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_30,__first,
             __first + sVar1,&local_31);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->m_dlocal,&local_30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_30);
  std::allocator<unsigned_long>::~allocator(&local_31);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->m_dlocal,0)
  ;
  this->m_d = pvVar2;
  return this;
}

Assistant:

variable_set& operator=(const variable_set& B) {
		m_v = B.m_v;
		m_dlocal = std::vector < vsize > (B.m_d, B.m_d + B.size());
		m_d = &m_dlocal[0];
		return *this;
	}